

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O1

bool __thiscall
compiler::EmissionContext::GetDeclarationIndex
          (EmissionContext *this,string *var,size_t *index,bool considerPartiallyBound)

{
  size_t sVar1;
  pointer pVVar2;
  pointer pcVar3;
  size_t sVar4;
  size_t __n;
  iterator __position;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  int iVar5;
  ulong uVar6;
  char *this_00;
  long lVar7;
  ClosureContext *__args;
  bool *pbVar8;
  bool bVar9;
  
  sVar1 = this->firstFreeVariablesIndex;
  bVar9 = sVar1 != 0;
  if (bVar9) {
    pVVar2 = (this->variables).
             super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->variables).
                   super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 3) *
            -0x3333333333333333;
    pcVar3 = (var->_M_dataplus)._M_p;
    sVar4 = var->_M_string_length;
    lVar7 = 1 - sVar1;
    pbVar8 = &pVVar2[sVar1 - 1].isFullyBound;
    do {
      if (uVar6 <= sVar1 - 1) {
        __args = (ClosureContext *)-lVar7;
        this_00 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   __args,uVar6);
        __position._M_current =
             *(ClosureContext **)
              ((vector<compiler::ClosureContext,std::allocator<compiler::ClosureContext>> *)this_00
              + 8);
        if (__position._M_current !=
            *(ClosureContext **)
             ((vector<compiler::ClosureContext,std::allocator<compiler::ClosureContext>> *)this_00 +
             0x10)) {
          ((__position._M_current)->value)._M_dataplus._M_p =
               (pointer)&((__position._M_current)->value).field_2;
          pcVar3 = (__args->value)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__position._M_current,pcVar3,
                     pcVar3 + (__args->value)._M_string_length);
          sVar1 = __args->localScopeIndex;
          (__position._M_current)->outerScopeCount = __args->outerScopeCount;
          (__position._M_current)->localScopeIndex = sVar1;
          *(long *)((vector<compiler::ClosureContext,std::allocator<compiler::ClosureContext>> *)
                    this_00 + 8) =
               *(long *)((vector<compiler::ClosureContext,std::allocator<compiler::ClosureContext>>
                          *)this_00 + 8) + 0x30;
          return (bool)extraout_AL;
        }
        std::vector<compiler::ClosureContext,std::allocator<compiler::ClosureContext>>::
        _M_realloc_insert<compiler::ClosureContext_const&>
                  ((vector<compiler::ClosureContext,std::allocator<compiler::ClosureContext>> *)
                   this_00,__position,__args);
        return (bool)extraout_AL_00;
      }
      if ((((*pbVar8 | considerPartiallyBound) == 1) &&
          (__n = *(size_t *)(pbVar8 + -0x18), __n == sVar4)) &&
         ((__n == 0 ||
          (iVar5 = bcmp((((VariableDeclaration *)(pbVar8 + -0x20))->value)._M_dataplus._M_p,pcVar3,
                        __n), iVar5 == 0)))) {
        *index = -lVar7;
        return bVar9;
      }
      lVar7 = lVar7 + 1;
      pbVar8 = pbVar8 + -0x28;
      bVar9 = lVar7 != 1;
    } while (bVar9);
  }
  return bVar9;
}

Assistant:

bool GetDeclarationIndex(const std::string & var, std::size_t& index, bool considerPartiallyBound) {

    for (std::size_t i = this->firstFreeVariablesIndex; i-- > 0;) {
      if (!variables.at(i).isFullyBound && !considerPartiallyBound) {
        continue;
      }

      if (variables.at(i).value == var) {
        index = i;
        return true;
      }
    }

    return false;
  }